

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswRarity.c
# Opt level: O0

void Ssw_RarSetDefaultParams(Ssw_RarPars_t *p)

{
  Ssw_RarPars_t *p_local;
  
  memset(p,0,0x60);
  p->nFrames = 0x14;
  p->nWords = 0x32;
  p->nBinSize = 8;
  p->nRounds = 0;
  p->nRestart = 0;
  p->nRandSeed = 0;
  p->TimeOut = 0;
  p->TimeOutGap = 0;
  p->fSolveAll = 0;
  p->fDropSatOuts = 0;
  p->fSetLastState = 0;
  p->fVerbose = 0;
  p->fNotVerbose = 0;
  return;
}

Assistant:

void Ssw_RarSetDefaultParams( Ssw_RarPars_t * p )
{
    memset( p, 0, sizeof(Ssw_RarPars_t) );
    p->nFrames       =  20;
    p->nWords        =  50;
    p->nBinSize      =   8;
    p->nRounds       =   0;
    p->nRestart      =   0;
    p->nRandSeed     =   0;
    p->TimeOut       =   0;
    p->TimeOutGap    =   0;
    p->fSolveAll     =   0;
    p->fDropSatOuts  =   0;
    p->fSetLastState =   0;
    p->fVerbose      =   0;
    p->fNotVerbose   =   0;
}